

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cnn.c
# Opt level: O0

void convolve_layer_mt(float **input,int in_width,int in_height,int in_stride,
                      CNN_LAYER_CONFIG *layer_config,CNN_THREAD_DATA *thread_data,float **output,
                      int out_stride)

{
  undefined4 in_ECX;
  undefined4 in_EDX;
  undefined4 in_ESI;
  undefined8 in_RDI;
  undefined8 in_R8;
  int *in_R9;
  undefined4 in_stack_00000010;
  int th_1;
  CONVOLVE_OPS convolve_op;
  AVxWorker *worker;
  int th;
  CONVOLVE_OPS convolve_ops [32];
  int num_workers;
  AVxWorkerInterface *winterface;
  int local_794;
  int local_78c;
  int local_784;
  undefined8 local_780;
  undefined4 local_778;
  undefined4 local_774;
  undefined4 local_770;
  undefined8 local_768;
  undefined4 local_758;
  int local_754;
  int local_750;
  AVxWorker *local_748;
  int local_73c;
  undefined1 local_738 [1796];
  int local_34;
  AVxWorkerInterface *local_30;
  int *local_28;
  undefined8 local_20;
  undefined4 local_14;
  undefined4 local_10;
  undefined4 local_c;
  undefined8 local_8;
  
  local_28 = in_R9;
  local_20 = in_R8;
  local_14 = in_ECX;
  local_10 = in_EDX;
  local_c = in_ESI;
  local_8 = in_RDI;
  local_30 = aom_get_worker_interface();
  local_34 = *local_28;
  local_73c = 0;
  while( true ) {
    if (local_34 < 0x20) {
      local_78c = local_34;
    }
    else {
      local_78c = 0x20;
    }
    if (local_78c <= local_73c) break;
    local_748 = (AVxWorker *)(*(long *)(local_28 + 2) + (long)local_73c * 0x38);
    (*local_30->reset)(local_748);
    local_780 = local_8;
    local_778 = local_c;
    local_774 = local_10;
    local_770 = local_14;
    local_768 = local_20;
    local_758 = in_stack_00000010;
    local_754 = local_73c;
    local_750 = local_34;
    memcpy(local_738 + (long)local_73c * 0x38,&local_780,0x38);
    local_748->hook = convolve_layer;
    local_748->data1 = local_738 + (long)local_73c * 0x38;
    local_748->data2 = (void *)0x0;
    if (local_73c == local_34 + -1) {
      (*local_30->execute)(local_748);
    }
    else {
      (*local_30->launch)(local_748);
    }
    local_73c = local_73c + 1;
  }
  local_784 = 0;
  while( true ) {
    if (local_34 < 0x20) {
      local_794 = local_34;
    }
    else {
      local_794 = 0x20;
    }
    if (local_794 <= local_784) break;
    (*local_30->sync)((AVxWorker *)(*(long *)(local_28 + 2) + (long)local_784 * 0x38));
    local_784 = local_784 + 1;
  }
  return;
}

Assistant:

static void convolve_layer_mt(const float **input, int in_width, int in_height,
                              int in_stride,
                              const CNN_LAYER_CONFIG *layer_config,
                              const CNN_THREAD_DATA *thread_data,
                              float **output, int out_stride) {
  const AVxWorkerInterface *const winterface = aom_get_worker_interface();
  const int num_workers = thread_data->num_workers;
  assert(thread_data->workers);

  CONVOLVE_OPS convolve_ops[CNN_MAX_THREADS];
  for (int th = 0; th < AOMMIN(num_workers, CNN_MAX_THREADS); ++th) {
    AVxWorker *const worker = &thread_data->workers[th];
    winterface->reset(worker);

    CONVOLVE_OPS convolve_op = { input,      in_width,     in_height,
                                 in_stride,  layer_config, output,
                                 out_stride, th,           num_workers };
    convolve_ops[th] = convolve_op;
    worker->hook = convolve_layer;
    worker->data1 = &(convolve_ops[th]);
    worker->data2 = NULL;

    // Start convolving.
    if (th == num_workers - 1) {
      winterface->execute(worker);
    } else {
      winterface->launch(worker);
    }
  }

  // Wait until all workers have finished.
  for (int th = 0; th < AOMMIN(num_workers, CNN_MAX_THREADS); ++th) {
    winterface->sync(&thread_data->workers[th]);
  }
}